

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_ltr_x86_64(CPUX86State *env,int selector)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int exception_index;
  uint uVar8;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  
  uVar6 = selector & 0xfffc;
  if (uVar6 == 0) {
    (env->tr).base = 0;
    (env->tr).limit = 0;
    (env->tr).flags = 0;
    goto LAB_0051eaa9;
  }
  if ((selector & 4U) != 0) {
LAB_0051eac1:
    raise_exception_err_ra_x86_64(env,0xd,uVar6,unaff_retaddr);
  }
  uVar5 = env->hflags;
  if ((env->gdt).limit < (uVar5 >> 0xb & 8) + (selector & 0xfff8U) + 7) goto LAB_0051eac1;
  uVar8 = 2;
  uVar7 = 2;
  addr = (ulong)(selector & 0xfff8U) + (env->gdt).base;
  if (((uVar5 >> 0x17 & 1) != 0) && (uVar7 = 0, (~uVar5 & 3) != 0)) {
    uVar7 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,addr,uVar7,unaff_retaddr);
  if (((env->hflags >> 0x17 & 1) != 0) && (uVar8 = 0, (~env->hflags & 3) != 0)) {
    uVar8 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,uVar8,unaff_retaddr);
  if ((uVar2 & 0x1700) == 0x100) {
    if (-1 < (short)uVar2) {
      exception_index = 0xb;
      goto LAB_0051eae5;
    }
    uVar5 = env->hflags;
    if ((uVar5 >> 0xe & 1) == 0) {
      (env->tr).base = (ulong)(uVar2 & 0xff000000 | uVar1 >> 0x10 | (uVar2 & 0xff) << 0x10);
      uVar5 = uVar2 & 0xf0000 | uVar1 & 0xffff;
      uVar6 = uVar5 << 0xc | 0xfff;
      if ((uVar2 >> 0x17 & 1) == 0) {
        uVar6 = uVar5;
      }
      (env->tr).limit = uVar6;
      (env->tr).flags = uVar2;
    }
    else {
      uVar8 = 2;
      uVar7 = 2;
      if (((uVar5 >> 0x17 & 1) != 0) && (uVar7 = 0, (~uVar5 & 3) != 0)) {
        uVar7 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,uVar7,unaff_retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar8 = 0, (~env->hflags & 3) != 0)) {
        uVar8 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0xc,uVar8,unaff_retaddr);
      if ((uVar4 & 0xf00) != 0) goto LAB_0051ead3;
      uVar5 = uVar2 & 0xf0000 | uVar1 & 0xffff;
      uVar6 = uVar5 << 0xc | 0xfff;
      if ((uVar2 >> 0x17 & 1) == 0) {
        uVar6 = uVar5;
      }
      (env->tr).limit = uVar6;
      (env->tr).flags = uVar2;
      (env->tr).base = CONCAT44(uVar3,uVar2 & 0xff000000 | uVar1 >> 0x10 | (uVar2 & 0xff) << 0x10);
    }
    uVar6 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    cpu_stl_mmuidx_ra_x86_64(env,addr + 4,uVar2 | 0x200,uVar6,unaff_retaddr);
LAB_0051eaa9:
    (env->tr).selector = selector & 0xffff;
    return;
  }
LAB_0051ead3:
  exception_index = 0xd;
LAB_0051eae5:
  raise_exception_err_ra_x86_64(env,exception_index,uVar6,unaff_retaddr);
}

Assistant:

void helper_ltr(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, type, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* NULL selector case: invalid TR */
        env->tr.base = 0;
        env->tr.limit = 0;
        env->tr.flags = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((e2 & DESC_S_MASK) ||
            (type != 1 && type != 9)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3, e4;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            e4 = cpu_ldl_kernel_ra(env, ptr + 12, GETPC());
            if ((e4 >> DESC_TYPE_SHIFT) & 0xf) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            load_seg_cache_raw_dt(&env->tr, e1, e2);
            env->tr.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->tr, e1, e2);
        }
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
    }
    env->tr.selector = selector;
}